

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O1

int32_t ra_get_index(roaring_array_t *ra,uint16_t x)

{
  ushort uVar1;
  int iVar2;
  bool bVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  
  iVar2 = ra->size;
  if (((long)iVar2 == 0) || (ra->keys[(long)iVar2 + -1] == x)) {
    uVar4 = iVar2 - 1;
  }
  else {
    uVar5 = iVar2 - 1;
    uVar7 = 0;
    uVar6 = uVar5;
    do {
      if ((int)uVar5 < (int)uVar7) {
        return ~uVar7;
      }
      uVar4 = uVar7 + uVar5 >> 1;
      uVar1 = *(ushort *)((long)ra->keys + (ulong)(uVar7 + uVar5 & 0xfffffffe));
      if (uVar1 < x) {
        uVar7 = uVar4 + 1;
        bVar3 = true;
        uVar4 = uVar6;
      }
      else if (x < uVar1) {
        uVar5 = uVar4 - 1;
        bVar3 = true;
        uVar4 = uVar6;
      }
      else {
        bVar3 = false;
      }
      uVar6 = uVar4;
    } while (bVar3);
  }
  return uVar4;
}

Assistant:

inline int32_t ra_get_index(const roaring_array_t *ra, uint16_t x) {
    if ((ra->size == 0) || ra->keys[ra->size - 1] == x) return ra->size - 1;
    return binarySearch(ra->keys, (int32_t)ra->size, x);
}